

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O0

llb_build_key_t * llb_build_key_make_stat(char *path)

{
  CAPIBuildKey *this;
  StringRef path_00;
  char *local_68;
  BuildKey *local_50 [2];
  BuildKey local_40;
  BuildKey *local_20;
  char *path_local;
  BuildKey **local_10;
  
  local_20 = (BuildKey *)path;
  this = (CAPIBuildKey *)operator_new(0x38);
  local_10 = local_50;
  path_local = (char *)local_20;
  local_50[0] = local_20;
  if (local_20 == (BuildKey *)0x0) {
    local_68 = (char *)0x0;
  }
  else {
    local_68 = (char *)strlen((char *)local_20);
  }
  path_00.Length = (size_t)local_68;
  path_00.Data = local_68;
  llbuild::buildsystem::BuildKey::makeStat(&local_40,local_50[0],path_00);
  anon_unknown.dwarf_1e10c2::CAPIBuildKey::CAPIBuildKey(this,&local_40);
  llbuild::buildsystem::BuildKey::~BuildKey(&local_40);
  return (llb_build_key_t *)this;
}

Assistant:

llb_build_key_t *llb_build_key_make_stat(const char *path) {
  return (llb_build_key_t *)new CAPIBuildKey(BuildKey::makeStat(StringRef(path)));
}